

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.hpp
# Opt level: O3

void __thiscall
jsoncons::basic_json_reader<char,_jsoncons::string_source<char>,_std::allocator<char>_>::read_next
          (basic_json_reader<char,_jsoncons::string_source<char>,_std::allocator<char>_> *this,
          error_code *ec)

{
  basic_json_parser<char,_std::allocator<char>_> *this_00;
  parse_state pVar1;
  char_type *pcVar2;
  char_type *pcVar3;
  bool bVar4;
  span<const_char,_18446744073709551615UL> sVar5;
  
  this_00 = &this->parser_;
  basic_json_parser<char,_std::allocator<char>_>::reset(this_00);
  while ((this->parser_).more_ == true) {
    pcVar3 = (this->parser_).end_input_;
    pcVar2 = (this->parser_).input_ptr_;
    if (pcVar2 == pcVar3) {
      sVar5 = json_source_adaptor<jsoncons::string_source<char>_>::read_buffer(&this->source_,ec);
      pcVar2 = sVar5.data_;
      if (ec->_M_value != 0) {
        return;
      }
      if (sVar5.size_ == 0) {
        pcVar3 = (this->parser_).end_input_;
        pcVar2 = (this->parser_).input_ptr_;
      }
      else {
        (this->parser_).begin_input_ = pcVar2;
        pcVar3 = pcVar2 + sVar5.size_;
        (this->parser_).end_input_ = pcVar3;
        (this->parser_).input_ptr_ = pcVar2;
      }
    }
    basic_json_parser<char,_std::allocator<char>_>::parse_some_(this_00,this->visitor_,ec);
    bVar4 = ec->_M_value != 0;
    if (pcVar2 == pcVar3 && !bVar4) {
      pVar1 = (this->parser_).state_;
      if (pVar1 == start) break;
      bVar4 = false;
      if ((pVar1 != accept) && (((this->parser_).done_ & 1U) == 0)) {
        std::error_code::operator=(ec,unexpected_eof);
        return;
      }
    }
    if (bVar4) {
      return;
    }
  }
  basic_json_parser<char,_std::allocator<char>_>::skip_whitespace(this_00);
  while( true ) {
    if ((this->source_).source_.current_ == (this->source_).source_.end_) {
      return;
    }
    basic_json_parser<char,_std::allocator<char>_>::skip_whitespace(this_00);
    if ((this->parser_).input_ptr_ != (this->parser_).end_input_) break;
    sVar5 = json_source_adaptor<jsoncons::string_source<char>_>::read_buffer(&this->source_,ec);
    pcVar3 = sVar5.data_;
    if (ec->_M_value != 0) {
      return;
    }
    if (sVar5.size_ != 0) {
      (this->parser_).begin_input_ = pcVar3;
      (this->parser_).end_input_ = pcVar3 + sVar5.size_;
      (this->parser_).input_ptr_ = pcVar3;
    }
  }
  return;
}

Assistant:

void read_next(std::error_code& ec)
        {
            if (source_.is_error())
            {
                ec = json_errc::source_error;
                return;
            }        
            parser_.reset();
            while (!parser_.stopped())
            {
                if (parser_.source_exhausted())
                {
                    auto s = source_.read_buffer(ec);
                    if (JSONCONS_UNLIKELY(ec)) return;
                    if (s.size() > 0)
                    {
                        parser_.update(s.data(),s.size());
                    }
                }
                bool eof = parser_.source_exhausted();
                parser_.parse_some(visitor_, ec);
                if (JSONCONS_UNLIKELY(ec)) return;
                if (eof)
                {
                    if (parser_.enter())
                    {
                        break;
                    }
                    else if (!parser_.accept())
                    {
                        ec = json_errc::unexpected_eof;
                        return;
                    }
                }
            }
            
            parser_.skip_whitespace();
            while (!source_.eof())
            {
                parser_.skip_whitespace();
                if (parser_.source_exhausted())
                {
                    auto s = source_.read_buffer(ec);
                    if (JSONCONS_UNLIKELY(ec)) return;
                    if (s.size() > 0)
                    {
                        parser_.update(s.data(),s.size());
                    }
                }
                else
                {
                    break;
                }
            }
        }